

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O3

int resolve_string(dwarf_sections *dwarf_sections,int is_dwarf64,int is_bigendian,
                  uint64_t str_offsets_base,attr_val *val,backtrace_error_callback error_callback,
                  void *data,char **string)

{
  uint32_t uVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  char local_128 [8];
  char b [200];
  undefined1 local_58 [8];
  dwarf_buf offset_buf;
  
  if (val->encoding == ATTR_VAL_STRING_INDEX) {
    lVar4 = ((val->u).uint << (is_dwarf64 == 0 ^ 3U)) + str_offsets_base;
    if (dwarf_sections->size[6] < lVar4 + (ulong)(is_dwarf64 != 0) * 4 + 4) {
      iVar3 = 0;
      (*error_callback)(data,"DW_FORM_strx value out of range",0);
    }
    else {
      local_58 = (undefined1  [8])0x1371cc;
      offset_buf.name = (char *)dwarf_sections->data[6];
      offset_buf.start = (uchar *)offset_buf.name + lVar4;
      offset_buf.buf = (uchar *)(dwarf_sections->size[6] - lVar4);
      offset_buf.error_callback = (backtrace_error_callback)data;
      offset_buf.data._0_4_ = 0;
      offset_buf.left._0_4_ = is_bigendian;
      offset_buf._32_8_ = error_callback;
      if (is_dwarf64 == 0) {
        uVar1 = read_uint32((dwarf_buf *)local_58);
        uVar2 = (ulong)uVar1;
      }
      else {
        uVar2 = read_uint64((dwarf_buf *)local_58);
      }
      if (uVar2 < dwarf_sections->size[4]) {
        *string = (char *)(dwarf_sections->data[4] + uVar2);
        iVar3 = 1;
      }
      else {
        iVar3 = 0;
        snprintf(local_128,200,"%s in %s at %d","DW_FORM_strx offset out of range",local_58,
                 (ulong)(uint)((int)offset_buf.start - (int)offset_buf.name));
        (*(code *)offset_buf._32_8_)(offset_buf.error_callback,local_128,0);
      }
    }
  }
  else {
    iVar3 = 1;
    if (val->encoding == ATTR_VAL_STRING) {
      *string = (char *)val->u;
    }
  }
  return iVar3;
}

Assistant:

static int
resolve_string (const struct dwarf_sections *dwarf_sections, int is_dwarf64,
		int is_bigendian, uint64_t str_offsets_base,
		const struct attr_val *val,
		backtrace_error_callback error_callback, void *data,
		const char **string)
{
  switch (val->encoding)
    {
    case ATTR_VAL_STRING:
      *string = val->u.string;
      return 1;

    case ATTR_VAL_STRING_INDEX:
      {
	uint64_t offset;
	struct dwarf_buf offset_buf;

	offset = val->u.uint * (is_dwarf64 ? 8 : 4) + str_offsets_base;
	if (offset + (is_dwarf64 ? 8 : 4)
	    > dwarf_sections->size[DEBUG_STR_OFFSETS])
	  {
	    error_callback (data, "DW_FORM_strx value out of range", 0);
	    return 0;
	  }

	offset_buf.name = ".debug_str_offsets";
	offset_buf.start = dwarf_sections->data[DEBUG_STR_OFFSETS];
	offset_buf.buf = dwarf_sections->data[DEBUG_STR_OFFSETS] + offset;
	offset_buf.left = dwarf_sections->size[DEBUG_STR_OFFSETS] - offset;
	offset_buf.is_bigendian = is_bigendian;
	offset_buf.error_callback = error_callback;
	offset_buf.data = data;
	offset_buf.reported_underflow = 0;

	offset = read_offset (&offset_buf, is_dwarf64);
	if (offset >= dwarf_sections->size[DEBUG_STR])
	  {
	    dwarf_buf_error (&offset_buf,
			     "DW_FORM_strx offset out of range",
			     0);
	    return 0;
	  }
	*string = (const char *) dwarf_sections->data[DEBUG_STR] + offset;
	return 1;
      }

    default:
      return 1;
    }
}